

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O3

RuleBuilder * __thiscall Potassco::RuleBuilder::end(RuleBuilder *this,AbstractProgram *out)

{
  uint uVar1;
  void *pvVar2;
  uint *puVar3;
  uint uVar4;
  Sum_t local_58;
  void *local_40;
  ulong local_38;
  
  puVar3 = (uint *)(this->mem_).beg_;
  *puVar3 = *puVar3 | 0x80000000;
  if (out != (AbstractProgram *)0x0) {
    uVar4 = puVar3[1] >> 0x1e;
    if (uVar4 == 2) {
      puVar3 = (uint *)MemoryRegion::operator[]
                                 (&this->mem_,
                                  (ulong)(*(uint *)((long)(this->mem_).beg_ + 0xc) & 0x3fffffff) - 4
                                 );
      uVar4 = *puVar3;
      sum(&local_58,this);
      (*out->_vptr_AbstractProgram[6])(out,(ulong)uVar4,&local_58);
    }
    else if (puVar3[3] < 0x40000000) {
      pvVar2 = (this->mem_).beg_;
      local_58.lits.first =
           (WeightLit_t *)
           MemoryRegion::operator[](&this->mem_,(ulong)*(uint *)((long)pvVar2 + 4) & 0x3fffffff);
      local_58.lits.size =
           (size_t)(*(int *)((long)pvVar2 + 8) - (*(uint *)((long)pvVar2 + 4) & 0x3fffffff) >> 2);
      pvVar2 = (this->mem_).beg_;
      local_40 = MemoryRegion::operator[]
                           (&this->mem_,(ulong)*(uint *)((long)pvVar2 + 0xc) & 0x3fffffff);
      local_38 = (ulong)(*(int *)((long)pvVar2 + 0x10) -
                         (*(uint *)((long)pvVar2 + 0xc) & 0x3fffffff) >> 2);
      (*out->_vptr_AbstractProgram[4])(out,(ulong)uVar4,&local_58);
    }
    else {
      pvVar2 = (this->mem_).beg_;
      local_40 = MemoryRegion::operator[]
                           (&this->mem_,(ulong)*(uint *)((long)pvVar2 + 4) & 0x3fffffff);
      local_38 = (ulong)(*(int *)((long)pvVar2 + 8) - (*(uint *)((long)pvVar2 + 4) & 0x3fffffff) >>
                        2);
      puVar3 = (uint *)MemoryRegion::operator[]
                                 (&this->mem_,
                                  ((ulong)*(uint *)((long)(this->mem_).beg_ + 0xc) & 0x3fffffff) - 4
                                 );
      uVar1 = *puVar3;
      sum(&local_58,this);
      (*out->_vptr_AbstractProgram[5])(out,(ulong)uVar4,&local_40,(ulong)uVar1,&local_58);
    }
  }
  return this;
}

Assistant:

RuleBuilder& RuleBuilder::end(AbstractProgram* out) {
	Rule* r = rule_();
	r->fix  = 1;
	if (!out) { return *this; }
	if (r->head.type != Directive_t::Minimize && r->body.type == Body_t::Normal) {
		out->rule(static_cast<Head_t>(r->head.type), head(), body());
	}
	else {
		if   (r->head.type != Directive_t::Minimize) { out->rule(static_cast<Head_t>(r->head.type), head(), *bound_(), sum().lits); }
		else                                         { out->minimize(*bound_(), sum().lits); }
	}
	return *this;
}